

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordinationNumber.cpp
# Opt level: O2

void __thiscall
OpenMD::GCN::GCN(GCN *this,SimInfo *info,string *filename,string *sele1,string *sele2,RealType rCut,
                int bins)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  CoordinationNumber::CoordinationNumber
            (&this->super_CoordinationNumber,info,filename,sele1,sele2,rCut,bins);
  (this->super_CoordinationNumber).super_StaticAnalyser._vptr_StaticAnalyser =
       (_func_int **)&PTR__CoordinationNumber_002ed660;
  getPrefix(&local_30,filename);
  std::operator+(&local_50,&local_30,".gcn");
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_CoordinationNumber).super_StaticAnalyser.outputFilename_);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Generalized Coordination Number",(allocator<char> *)&local_30);
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_CoordinationNumber).super_StaticAnalyser.analysisType_);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

GCN::GCN(SimInfo* info, const std::string& filename, const std::string& sele1,
           const std::string& sele2, RealType rCut, int bins) :
      CoordinationNumber(info, filename, sele1, sele2, rCut, bins) {
    setOutputName(getPrefix(filename) + ".gcn");
    setAnalysisType("Generalized Coordination Number");
  }